

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O0

void __thiscall
BackwardPass::InsertTypeTransitionAtBlock
          (BackwardPass *this,BasicBlock *block,int symId,AddPropertyCacheBucket *data,
          BVSparse<Memory::JitArenaAllocator> *upwardExposedUses)

{
  Var pvVar1;
  code *pcVar2;
  bool bVar3;
  Instr *pIVar4;
  undefined4 *puVar5;
  Opnd *pOVar6;
  RegOpnd *pRVar7;
  AddrOpnd *pAVar8;
  JITType *pJVar9;
  Var pvVar10;
  Instr *local_70;
  JITTypeHolderBase<void> local_60;
  JITTypeHolderBase<void> local_58;
  Instr *local_50;
  Instr *instr;
  Instr *instrStop;
  Instr *__prevInstrCheck;
  BVSparse<Memory::JitArenaAllocator> *pBStack_30;
  bool inserted;
  BVSparse<Memory::JitArenaAllocator> *upwardExposedUses_local;
  AddPropertyCacheBucket *data_local;
  BasicBlock *pBStack_18;
  int symId_local;
  BasicBlock *block_local;
  BackwardPass *this_local;
  
  __prevInstrCheck._7_1_ = 0;
  instrStop = (Instr *)0x0;
  pBStack_30 = upwardExposedUses;
  upwardExposedUses_local = (BVSparse<Memory::JitArenaAllocator> *)data;
  data_local._4_4_ = symId;
  pBStack_18 = block;
  block_local = (BasicBlock *)this;
  pIVar4 = BasicBlock::GetLastInstr(block);
  if (pIVar4 == (Instr *)0x0) {
    local_70 = (Instr *)0x0;
  }
  else {
    pIVar4 = BasicBlock::GetLastInstr(pBStack_18);
    local_70 = pIVar4->m_next;
  }
  instr = local_70;
  local_50 = BasicBlock::GetFirstInstr(pBStack_18);
  do {
    if (local_50 == instr) {
LAB_004e2571:
      if ((__prevInstrCheck._7_1_ & 1) == 0) {
        pIVar4 = BasicBlock::GetLastInstr(pBStack_18);
        if (pIVar4->m_next == (Instr *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x17a4,"(block->GetLastInstr()->m_next)",
                             "block->GetLastInstr()->m_next");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 0;
        }
        pIVar4 = BasicBlock::GetLastInstr(pBStack_18);
        InsertTypeTransition
                  (this,pIVar4->m_next,data_local._4_4_,
                   (AddPropertyCacheBucket *)upwardExposedUses_local,pBStack_30);
      }
      return;
    }
    if ((instrStop != (Instr *)0x0) && (instrStop->m_next != local_50)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x1787,
                         "(__prevInstrCheck == nullptr || __prevInstrCheck->m_next == instr)",
                         "Modifying instr list but not using EDITING iterator!");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    instrStop = local_50;
    bVar3 = IR::Instr::IsRealInstr(local_50);
    if (bVar3) {
      if (local_50->m_opcode != AdjustObjType) {
        InsertTypeTransition
                  (this,local_50,data_local._4_4_,(AddPropertyCacheBucket *)upwardExposedUses_local,
                   pBStack_30);
        __prevInstrCheck._7_1_ = 1;
        goto LAB_004e2571;
      }
      pOVar6 = IR::Instr::GetSrc1(local_50);
      pRVar7 = IR::Opnd::AsRegOpnd(pOVar6);
      if ((pRVar7->m_sym->super_Sym).m_id == data_local._4_4_) {
        pOVar6 = IR::Instr::GetDst(local_50);
        pAVar8 = IR::Opnd::AsAddrOpnd(pOVar6);
        pvVar1 = pAVar8->m_address;
        local_58.t = (Type)AddPropertyCacheBucket::GetFinalType
                                     ((AddPropertyCacheBucket *)upwardExposedUses_local);
        pJVar9 = JITTypeHolderBase<void>::operator->(&local_58);
        pvVar10 = (Var)JITType::GetAddr(pJVar9);
        bVar3 = false;
        if (pvVar1 == pvVar10) {
          pOVar6 = IR::Instr::GetSrc2(local_50);
          pAVar8 = IR::Opnd::AsAddrOpnd(pOVar6);
          pvVar1 = pAVar8->m_address;
          local_60.t = (Type)AddPropertyCacheBucket::GetInitialType
                                       ((AddPropertyCacheBucket *)upwardExposedUses_local);
          pJVar9 = JITTypeHolderBase<void>::operator->(&local_60);
          pvVar10 = (Var)JITType::GetAddr(pJVar9);
          bVar3 = pvVar1 == pvVar10;
        }
        if (bVar3) {
          return;
        }
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x1794,
                           "((intptr_t)instr->GetDst()->AsAddrOpnd()->m_address == data->GetFinalType()->GetAddr() && (intptr_t)instr->GetSrc2()->AsAddrOpnd()->m_address == data->GetInitialType()->GetAddr())"
                           ,
                           "(intptr_t)instr->GetDst()->AsAddrOpnd()->m_address == data->GetFinalType()->GetAddr() && (intptr_t)instr->GetSrc2()->AsAddrOpnd()->m_address == data->GetInitialType()->GetAddr()"
                          );
        if (bVar3) {
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 0;
          return;
        }
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
    }
    local_50 = local_50->m_next;
  } while( true );
}

Assistant:

void
BackwardPass::InsertTypeTransitionAtBlock(BasicBlock *block, int symId, AddPropertyCacheBucket *data, BVSparse<JitArenaAllocator>* upwardExposedUses)
{
    bool inserted = false;
    FOREACH_INSTR_IN_BLOCK(instr, block)
    {
        if (instr->IsRealInstr())
        {
            // Check for pre-existing type transition. There may be more than one AdjustObjType here,
            // so look at them all.
            if (instr->m_opcode == Js::OpCode::AdjustObjType)
            {
                if (instr->GetSrc1()->AsRegOpnd()->m_sym->m_id == (SymID)symId)
                {
                    // This symbol already has a type transition at this point.
                    // It *must* be doing the same transition we're already trying to do.
                    Assert((intptr_t)instr->GetDst()->AsAddrOpnd()->m_address == data->GetFinalType()->GetAddr() &&
                           (intptr_t)instr->GetSrc2()->AsAddrOpnd()->m_address == data->GetInitialType()->GetAddr());
                    // Nothing to do.
                    return;
                }
            }
            else
            {
                this->InsertTypeTransition(instr, symId, data, upwardExposedUses);
                inserted = true;
                break;
            }
        }
    }
    NEXT_INSTR_IN_BLOCK;
    if (!inserted)
    {
        Assert(block->GetLastInstr()->m_next);
        this->InsertTypeTransition(block->GetLastInstr()->m_next, symId, data, upwardExposedUses);
    }
}